

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void google::protobuf::internal::OnShutdownRun(_func_void_void_ptr *f,void *arg)

{
  ShutdownData *this;
  pair<void_(*)(const_void_*),_const_void_*> local_30;
  
  this = ShutdownData::get();
  std::mutex::lock(&(this->mutex).mu_);
  local_30.first = f;
  local_30.second = arg;
  std::
  vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
  ::emplace_back<std::pair<void(*)(void_const*),void_const*>>
            ((vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
              *)this,&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void OnShutdownRun(void (*f)(const void*), const void* arg) {
  auto shutdown_data = ShutdownData::get();
  MutexLock lock(&shutdown_data->mutex);
  shutdown_data->functions.push_back(std::make_pair(f, arg));
}